

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O1

BaseStatistics *
duckdb::StringStats::CreateUnknown(BaseStatistics *__return_storage_ptr__,LogicalType *type)

{
  LogicalType LStack_28;
  
  LogicalType::LogicalType(&LStack_28,type);
  BaseStatistics::BaseStatistics(__return_storage_ptr__,&LStack_28);
  LogicalType::~LogicalType(&LStack_28);
  __return_storage_ptr__->has_null = true;
  __return_storage_ptr__->has_no_null = true;
  *(data_t *)&__return_storage_ptr__->stats_union = '\0';
  *(data_t *)((long)&__return_storage_ptr__->stats_union + 1) = '\0';
  *(data_t *)((long)&__return_storage_ptr__->stats_union + 2) = '\0';
  *(data_t *)((long)&__return_storage_ptr__->stats_union + 3) = '\0';
  *(data_t *)((long)&__return_storage_ptr__->stats_union + 4) = '\0';
  *(data_t *)((long)&__return_storage_ptr__->stats_union + 5) = '\0';
  *(data_t *)((long)&__return_storage_ptr__->stats_union + 6) = '\0';
  *(data_t *)((long)&__return_storage_ptr__->stats_union + 7) = '\0';
  *(undefined8 *)((long)&__return_storage_ptr__->stats_union + 8) = 0xffffffffffffffff;
  (__return_storage_ptr__->stats_union).string_data.max_string_length = 0;
  *(undefined2 *)((long)&__return_storage_ptr__->stats_union + 0x10) = 1;
  return __return_storage_ptr__;
}

Assistant:

BaseStatistics StringStats::CreateUnknown(LogicalType type) {
	BaseStatistics result(std::move(type));
	result.InitializeUnknown();
	auto &string_data = StringStats::GetDataUnsafe(result);
	for (idx_t i = 0; i < StringStatsData::MAX_STRING_MINMAX_SIZE; i++) {
		string_data.min[i] = 0;
		string_data.max[i] = 0xFF;
	}
	string_data.max_string_length = 0;
	string_data.has_max_string_length = false;
	string_data.has_unicode = true;
	return result;
}